

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

bool menu_bar_sub_item_active_2_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_40;
  Am_Object main_item;
  Am_Object win;
  Am_Object local_20;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_20,0x17d,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
    if (!bVar1) {
      self_local._7_1_ = 0;
      goto LAB_00362aed;
    }
  }
  pAVar2 = Am_Object::Get((Am_Object *)owner.data,0x68,0);
  Am_Object::Am_Object(&main_item,pAVar2);
  bVar1 = Am_Object::Valid(&main_item);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&main_item,0x1d3,0);
    Am_Object::Am_Object(&local_40,pAVar2);
    bVar1 = Am_Object::Valid(&local_40);
    if (bVar1) {
      pAVar2 = Am_Object::Get(&local_40,0x17d,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      if (bVar1) goto LAB_00362ab1;
      self_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
LAB_00362ab1:
      bVar1 = false;
    }
    Am_Object::~Am_Object(&local_40);
    if (!bVar1) goto LAB_00362acc;
  }
  else {
LAB_00362acc:
    self_local._7_1_ = 1;
  }
  Am_Object::~Am_Object(&main_item);
LAB_00362aed:
  Am_Object::~Am_Object(&local_20);
  return (bool)(self_local._7_1_ & 1);
}

Assistant:

Am_Define_Formula(bool, menu_bar_sub_item_active_2)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && !(bool)owner.Get(Am_ACTIVE_2))
    return false;
  // now check the main-item I am attached to, if any
  Am_Object win = self.Get(Am_WINDOW);
  if (win.Valid()) {
    Am_Object main_item = win.Get(Am_FOR_ITEM);
    if (main_item.Valid() && !(bool)main_item.Get(Am_ACTIVE_2))
      return false;
  }
  return true;
}